

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O3

coop_ref_t __thiscall
so_5::impl::coop_repository_details::deregistration_processor_t::ensure_root_coop_exists
          (deregistration_processor_t *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  iterator iVar3;
  long *plVar4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long *in_RSI;
  coop_ref_t cVar7;
  long *local_58;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
                  *)(*in_RSI + 0x38),(key_type *)in_RSI[1]);
  _Var6._M_pi = extraout_RDX;
  if ((_Base_ptr)(*in_RSI + 0x40) == iVar3._M_node) {
    std::operator+(&local_38,"coop with name \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI[1]);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_48 = *plVar5;
      lStack_40 = plVar4[3];
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar5;
      local_58 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    exception_t::raise(0x24983e);
    _Var6._M_pi = extraout_RDX_00;
    if (local_58 != &local_48) {
      operator_delete(local_58);
      _Var6._M_pi = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
      _Var6._M_pi = extraout_RDX_02;
    }
  }
  p_Var2 = iVar3._M_node[2]._M_parent;
  p_Var1 = iVar3._M_node[2]._M_parent;
  this->m_core = *(coop_repository_basis_t **)(iVar3._M_node + 2);
  this->m_root_coop_name = (string *)p_Var2;
  if (p_Var1 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
    }
  }
  cVar7.super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  cVar7.super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (coop_ref_t)cVar7.super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

coop_ref_t
deregistration_processor_t::ensure_root_coop_exists() const
{
	// It is an error if the cooperation is not registered.
	auto it = m_core.m_registered_coop.find( m_root_coop_name );

	if( m_core.m_registered_coop.end() == it )
	{
		SO_5_THROW_EXCEPTION(
			rc_coop_has_not_found_among_registered_coop,
			"coop with name '" + m_root_coop_name +
			"' not found among registered cooperations" );
	}

	return it->second;
}